

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-pool.cpp
# Opt level: O2

bool __thiscall
MemPool::deleteRecord(MemPool *this,uchar *blkAddress,uint relativeOffset,uint recordSize)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  uchar *__first1;
  undefined8 uStack_20;
  
  this->memPoolUsedRecords = this->memPoolUsedRecords - recordSize;
  uVar3 = (ulong)recordSize;
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    blkAddress[uVar4 + relativeOffset] = '\0';
  }
  lVar1 = -(uVar3 + 0xf & 0xfffffffffffffff0);
  __first1 = &stack0xffffffffffffffe8 + lVar1;
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    __first1[uVar4] = '\0';
  }
  *(undefined8 *)((long)&uStack_20 + lVar1) = 0x1183da;
  bVar2 = std::__equal<true>::equal<unsigned_char>(__first1,__first1 + uVar3,blkAddress);
  if (bVar2) {
    this->memPoolUsedBlks = this->memPoolUsedBlks - this->blkSize;
  }
  return true;
}

Assistant:

bool MemPool::deleteRecord(uchar *blkAddress, uint relativeOffset, uint recordSize) {
    try {
        // to delete a record, we can change the values stored in that record to NULL
        // traverse from the beginning of the record address to the end based on the size of the record
        // fill the elements to the null character
        memPoolUsedRecords-=recordSize;
        fill(blkAddress+relativeOffset, blkAddress+relativeOffset+recordSize, '\0');

        uchar cmpBlk [recordSize];
        fill(cmpBlk, cmpBlk+recordSize, '\0');

        if(equal(cmpBlk, cmpBlk+recordSize, blkAddress)){
            memPoolUsedBlks-=blkSize;
        }

        return true;
    }

    catch(exception &e) {
        cout << "Exception" <<e.what() << "\n";
        cout << "Delete record or block failed" << "\n";
        return false;
    }
}